

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_EnumerateCallbackResult
enumerateFromMountPoint
          (DirHandle *i,char *arcfname,PHYSFS_EnumerateCallback callback,char *_fname,void *data)

{
  PHYSFS_EnumerateCallback p_Var1;
  PHYSFS_EnumerateCallbackResult PVar2;
  size_t sVar3;
  size_t sVar4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  char *__s;
  PHYSFS_EnumerateCallback *pp_Var8;
  PHYSFS_ErrorCode errcode;
  void **retval;
  PHYSFS_EnumerateCallback local_38;
  
  pp_Var8 = &local_38;
  local_38 = callback;
  sVar3 = strlen(arcfname);
  sVar4 = strlen(i->mountPoint);
  if (sVar4 + 1 < 0x100) {
    plVar5 = (long *)((long)&local_38 - (sVar4 + 0x18 & 0xfffffffffffffff0));
    lVar6 = 0;
    pp_Var8 = (PHYSFS_EnumerateCallback *)plVar5;
  }
  else {
    plVar5 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar4 + 9);
    if (plVar5 == (long *)0x0) {
      errcode = PHYSFS_ERR_OUT_OF_MEMORY;
      goto LAB_00108eb4;
    }
    lVar6 = 1;
    pp_Var8 = &local_38;
  }
  *plVar5 = lVar6;
  pcVar7 = i->mountPoint;
  ((long *)pp_Var8)[-1] = 0x108e5d;
  strcpy((char *)(plVar5 + 1),pcVar7);
  lVar6 = sVar3 + 1;
  if (sVar3 == 0) {
    lVar6 = 0;
  }
  __s = (char *)((long)plVar5 + lVar6 + 8);
  ((long *)pp_Var8)[-1] = 0x108e7d;
  pcVar7 = strchr(__s,0x2f);
  p_Var1 = local_38;
  if (pcVar7 == (char *)0x0) {
    ((long *)pp_Var8)[-1] = (long)verifyPath;
    __assert_fail("end",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                  ,0x97b,
                  "PHYSFS_EnumerateCallbackResult enumerateFromMountPoint(DirHandle *, const char *, PHYSFS_EnumerateCallback, const char *, void *)"
                 );
  }
  *pcVar7 = '\0';
  ((long *)pp_Var8)[-1] = 0x108e91;
  PVar2 = (*p_Var1)(data,_fname,__s);
  if (*plVar5 != 0) {
    ((long *)pp_Var8)[-1] = 0x108ea3;
    (*__PHYSFS_AllocatorHooks.Free)(plVar5);
  }
  if (PVar2 != PHYSFS_ENUM_ERROR) {
    return PVar2;
  }
  errcode = PHYSFS_ERR_APP_CALLBACK;
LAB_00108eb4:
  *(undefined8 *)((long)pp_Var8 + -8) = 0x108eb9;
  PHYSFS_setErrorCode(errcode);
  return PHYSFS_ENUM_ERROR;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumerateFromMountPoint(DirHandle *i,
                                    const char *arcfname,
                                    PHYSFS_EnumerateCallback callback,
                                    const char *_fname, void *data)
{
    PHYSFS_EnumerateCallbackResult retval;
    const size_t len = strlen(arcfname);
    char *ptr = NULL;
    char *end = NULL;
    const size_t slen = strlen(i->mountPoint) + 1;
    char *mountPoint = (char *) __PHYSFS_smallAlloc(slen);

    BAIL_IF(!mountPoint, PHYSFS_ERR_OUT_OF_MEMORY, PHYSFS_ENUM_ERROR);

    strcpy(mountPoint, i->mountPoint);
    ptr = mountPoint + ((len) ? len + 1 : 0);
    end = strchr(ptr, '/');
    assert(end);  /* should always find a terminating '/'. */
    *end = '\0';
    retval = callback(data, _fname, ptr);
    __PHYSFS_smallFree(mountPoint);

    BAIL_IF(retval == PHYSFS_ENUM_ERROR, PHYSFS_ERR_APP_CALLBACK, retval);
    return retval;
}